

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

void __thiscall
cmDependsFortran::MatchRemoteModules(cmDependsFortran *this,istream *fin,char *stampDir)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  string line;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  bVar3 = false;
  while( true ) {
    bVar2 = cmsys::SystemTools::GetLineFromStream(fin,&line,(bool *)0x0,-1);
    if (!bVar2) break;
    if (line._M_string_length != 0) {
      cVar1 = *line._M_dataplus._M_p;
      if ((cVar1 != '\r') && (cVar1 != '#')) {
        if (cVar1 == ' ') {
          bVar2 = bVar3 != false;
          bVar3 = false;
          if (bVar2) {
            bVar3 = true;
            ConsiderModule(this,line._M_dataplus._M_p + 1,stampDir);
          }
        }
        else {
          bVar3 = std::operator==(&line,"provides");
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&line);
  return;
}

Assistant:

void cmDependsFortran::MatchRemoteModules(std::istream& fin,
                                          const char* stampDir)
{
  std::string line;
  bool doing_provides = false;
  while(cmSystemTools::GetLineFromStream(fin, line))
    {
    // Ignore comments and empty lines.
    if(line.empty() || line[0] == '#' || line[0] == '\r')
      {
      continue;
      }

    if(line[0] == ' ')
      {
      if(doing_provides)
        {
        this->ConsiderModule(line.c_str()+1, stampDir);
        }
      }
    else if(line == "provides")
      {
      doing_provides = true;
      }
    else
      {
      doing_provides = false;
      }
    }
}